

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

uint __thiscall OpenMesh::PolyConnectivity::valence(PolyConnectivity *this,VertexHandle _vh)

{
  uint uVar1;
  undefined1 local_30 [8];
  ConstVertexVertexIter vv_it;
  
  cvv_iter((ConstVertexVertexIter *)local_30,this,_vh);
  uVar1 = 0;
  while ((vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    uVar1 = uVar1 + 1;
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
    ::operator++((ConstVertexVertexIter *)local_30);
  }
  return uVar1;
}

Assistant:

uint PolyConnectivity::valence(VertexHandle _vh) const
{
  uint count(0);
  for (ConstVertexVertexIter vv_it=cvv_iter(_vh); vv_it.is_valid(); ++vv_it)
    ++count;
  return count;
}